

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramAttacher::initAttachment
          (ShaderProgramAttacher *this,GLuint seed,GLuint shader)

{
  GLenum GVar1;
  deBool dVar2;
  Functions *pFVar3;
  TestError *this_00;
  int precision;
  int precision_00;
  int precision_01;
  float fVar4;
  GLint local_1b4;
  char *pcStack_1b0;
  GLint compileStatus;
  char *sourceStr;
  string source;
  allocator<char> local_161;
  key_type local_160;
  string local_140;
  allocator<char> local_119;
  key_type local_118;
  string local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  StringTemplate sourceTmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  Random rnd;
  GLuint shader_local;
  GLuint seed_local;
  ShaderProgramAttacher *this_local;
  
  de::Random::Random((Random *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count,seed);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&sourceTmpl.m_template.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "#version 100\nvoid main() { gl_FragColor = vec4(${RED}, ${GREEN}, ${BLUE}, 1.0); }\n",
             &local_99);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"RED",&local_d1);
  fVar4 = de::Random::getFloat((Random *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  de::floatToString_abi_cxx11_(&local_f8,(de *)&DAT_00000004,fVar4,precision);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&sourceTmpl.m_template.field_2 + 8),&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"GREEN",&local_119);
  fVar4 = de::Random::getFloat((Random *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  de::floatToString_abi_cxx11_(&local_140,(de *)&DAT_00000004,fVar4,precision_00);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&sourceTmpl.m_template.field_2 + 8),&local_118,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"BLUE",&local_161);
  fVar4 = de::Random::getFloat((Random *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
  de::floatToString_abi_cxx11_
            ((string *)((long)&source.field_2 + 8),(de *)&DAT_00000004,fVar4,precision_01);
  de::
  insert<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&sourceTmpl.m_template.field_2 + 8),&local_160,
             (mapped_type *)((long)&source.field_2 + 8));
  std::__cxx11::string::~string((string *)(source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  tcu::StringTemplate::specialize
            ((string *)&sourceStr,(StringTemplate *)local_78,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&sourceTmpl.m_template.field_2 + 8));
  pcStack_1b0 = (char *)std::__cxx11::string::c_str();
  do {
    glu::CallLogWrapper::glShaderSource
              (&(this->super_Attacher).super_ContextWrapper.super_CallLogWrapper,shader,1,
               &stack0xfffffffffffffe50,(GLint *)0x0);
    pFVar3 = ContextWrapper::gl(&(this->super_Attacher).super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glShaderSource(shader, 1, &sourceStr, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x1b0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::glCompileShader
              (&(this->super_Attacher).super_ContextWrapper.super_CallLogWrapper,shader);
    pFVar3 = ContextWrapper::gl(&(this->super_Attacher).super_ContextWrapper);
    GVar1 = (*pFVar3->getError)();
    glu::checkError(GVar1,"glCompileShader(shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x1b1);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  local_1b4 = 0;
  pFVar3 = ContextWrapper::gl(&(this->super_Attacher).super_ContextWrapper);
  (*pFVar3->getShaderiv)(shader,0x8b81,&local_1b4);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (local_1b4 != 0))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      std::__cxx11::string::~string((string *)&sourceStr);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)local_78);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&sourceTmpl.m_template.field_2 + 8));
      de::Random::~Random((Random *)&params._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,pcStack_1b0,"compileStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x1b6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ShaderProgramAttacher::initAttachment (GLuint seed, GLuint shader)
{
	using					de::insert;
	using					de::floatToString;

	Random					rnd(seed);
	map<string, string>		params;
	const StringTemplate	sourceTmpl	(s_fragmentShaderTemplate);

	insert(params, "RED",	floatToString(rnd.getFloat(), 4));
	insert(params, "GREEN",	floatToString(rnd.getFloat(), 4));
	insert(params, "BLUE",	floatToString(rnd.getFloat(), 4));

	{
		const string			source		= sourceTmpl.specialize(params);
		const char* const		sourceStr	= source.c_str();

		GLU_CHECK_CALL_ERROR(glShaderSource(shader, 1, &sourceStr, DE_NULL), gl().getError());
		GLU_CHECK_CALL_ERROR(glCompileShader(shader), gl().getError());

		{
			GLint compileStatus = 0;
			gl().getShaderiv(shader, GL_COMPILE_STATUS, &compileStatus);
			TCU_CHECK_MSG(compileStatus != 0, sourceStr);
		}
	}
}